

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase * EvaluateBreak(ExpressionEvalContext *ctx,ExprBreak *expression)

{
  StackFrame *pSVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  int iVar5;
  StackFrame **ppSVar6;
  ExprBase *pEVar7;
  undefined4 extraout_var;
  
  ppSVar6 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames);
  pSVar1 = *ppSVar6;
  if (pSVar1->targetYield == 0) {
    if (pSVar1->breakDepth != 0) {
      __assert_fail("frame->breakDepth == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0xbf1,"ExprBase *EvaluateBreak(ExpressionEvalContext &, ExprBreak *)");
    }
    pSVar1->breakDepth = *(uint *)&(expression->super_ExprBase).field_0x2c;
  }
  if (expression->closures != (ExprBase *)0x0) {
    pEVar7 = Evaluate(ctx,expression->closures);
    if (pEVar7 == (ExprBase *)0x0) {
      return (ExprBase *)0x0;
    }
  }
  pAVar2 = ctx->ctx->allocator;
  iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
  pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar5);
  pSVar3 = (expression->super_ExprBase).source;
  pTVar4 = ctx->ctx->typeVoid;
  pEVar7->typeID = 2;
  pEVar7->source = pSVar3;
  pEVar7->type = pTVar4;
  pEVar7->next = (ExprBase *)0x0;
  pEVar7->listed = false;
  pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240668;
  pEVar7 = CheckType(&expression->super_ExprBase,pEVar7);
  return pEVar7;
}

Assistant:

ExprBase* EvaluateBreak(ExpressionEvalContext &ctx, ExprBreak *expression)
{
	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	if(!frame->targetYield)
	{
		assert(frame->breakDepth == 0);

		frame->breakDepth = expression->depth;
	}

	if(expression->closures)
	{
		if(!Evaluate(ctx, expression->closures))
			return NULL;
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}